

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::geometry::anon_unknown_0::EmitTest::initPrograms
          (EmitTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d8 [40];
  string local_1b0;
  ostringstream src;
  string local_188 [368];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  poVar1 = std::operator<<((ostream *)&src,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 a_position;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in highp vec4 a_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp vec4 v_geom_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tgl_Position = a_position;\n");
  poVar1 = std::operator<<(poVar1,"\tv_geom_FragColor = a_color;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"vertex",&local_1f9);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1d8,&local_1b0);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_1d8);
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d8,"geometry",(allocator<char> *)&local_1b0);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,(string *)local_1d8);
  geometry::(anonymous_namespace)::EmitTest::shaderGeometry_abi_cxx11_(&local_1f8,this,false);
  glu::GeometrySource::GeometrySource((GeometrySource *)&src,&local_1f8);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)&src);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  if ((this->m_emitTestSpec).primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d8,"geometry_pointsize",(allocator<char> *)&local_1b0);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,(string *)local_1d8);
    geometry::(anonymous_namespace)::EmitTest::shaderGeometry_abi_cxx11_(&local_1f8,this,true);
    glu::GeometrySource::GeometrySource((GeometrySource *)&src,&local_1f8);
    glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)&src);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  poVar1 = std::operator<<((ostream *)&src,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 v_frag_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tfragColor = v_frag_FragColor;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"fragment",&local_1f9);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1f8);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1d8,&local_1b0);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_1d8);
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void EmitTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "layout(location = 0) in highp vec4 a_position;\n"
			<< "layout(location = 1) in highp vec4 a_color;\n"
			<< "layout(location = 0) out highp vec4 v_geom_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	gl_Position = a_position;\n"
			<< "	v_geom_FragColor = a_color;\n"
			<< "}\n";
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(shaderGeometry(false));
		if(m_emitTestSpec.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
			sourceCollections.glslSources.add("geometry_pointsize") << glu::GeometrySource(shaderGeometry(true));
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "layout(location = 0) out mediump vec4 fragColor;\n"
			<< "layout(location = 0) in highp vec4 v_frag_FragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	fragColor = v_frag_FragColor;\n"
			<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}